

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::AddRuneToString(Regexp *this,Rune r)

{
  int iVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  ulong uVar4;
  void *pvVar5;
  int local_24;
  int i;
  Rune *old;
  Rune r_local;
  Regexp *this_local;
  
  if (this->op_ != '\x04') {
    __assert_fail("op_ == kRegexpLiteralString",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",
                  0x9e,"void re2::Regexp::AddRuneToString(Rune)");
  }
  if ((this->field_7).field_0.max_ == 0) {
    pvVar3 = operator_new__(0x20);
    (this->field_7).the_union_[1] = pvVar3;
  }
  else if ((7 < (this->field_7).field_0.max_) &&
          (((this->field_7).field_0.max_ & (this->field_7).field_0.max_ - 1U) == 0)) {
    pvVar3 = (this->field_7).the_union_[1];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)((this->field_7).field_0.max_ << 1);
    uVar4 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    (this->field_7).the_union_[1] = pvVar5;
    for (local_24 = 0; local_24 < (this->field_7).field_0.max_; local_24 = local_24 + 1) {
      *(undefined4 *)((this->field_7).field_1.name_ + (long)local_24 * 4) =
           *(undefined4 *)((long)pvVar3 + (long)local_24 * 4);
    }
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
  }
  iVar1 = (this->field_7).field_0.max_;
  (this->field_7).field_0.max_ = iVar1 + 1;
  *(Rune *)((this->field_7).field_1.name_ + (long)iVar1 * 4) = r;
  return;
}

Assistant:

void Regexp::AddRuneToString(Rune r) {
  DCHECK(op_ == kRegexpLiteralString);
  if (nrunes_ == 0) {
    // start with 8
    runes_ = new Rune[8];
  } else if (nrunes_ >= 8 && (nrunes_ & (nrunes_ - 1)) == 0) {
    // double on powers of two
    Rune *old = runes_;
    runes_ = new Rune[nrunes_ * 2];
    for (int i = 0; i < nrunes_; i++)
      runes_[i] = old[i];
    delete[] old;
  }

  runes_[nrunes_++] = r;
}